

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexUtil.cpp
# Opt level: O1

vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> *
vkt::pipeline::createQuadMosaicCubeArray
          (vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
           *__return_storage_ptr__,int *faceArrayIndices)

{
  int iVar1;
  long lVar2;
  pointer pVVar3;
  int quadNdx;
  long lVar4;
  long lVar5;
  
  createQuadMosaicCube();
  pVVar3 = (__return_storage_ptr__->
           super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar4 = 0;
  do {
    iVar1 = faceArrayIndices[lVar4];
    lVar2 = 0;
    do {
      lVar5 = lVar2;
      *(float *)((long)(pVVar3->texCoord).m_data + lVar5 + 0xc) = (float)iVar1;
      lVar2 = lVar5 + 0x20;
    } while ((int)(lVar5 + 0x20) != 0xc0);
    lVar4 = lVar4 + 1;
    pVVar3 = (pointer)((long)pVVar3[1].position.m_data + lVar5);
  } while (lVar4 != 6);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vertex4Tex4> createQuadMosaicCubeArray (int faceArrayIndices[6])
{
	std::vector<Vertex4Tex4>			vertices	= createQuadMosaicCube();
	std::vector<Vertex4Tex4>::iterator	vertexItr	= vertices.begin();

	for (int quadNdx = 0; quadNdx < 6; quadNdx++)
	{
		for (int vertexNdx = 0; vertexNdx < 6; vertexNdx++)
		{
			vertexItr->texCoord.w() = (float)faceArrayIndices[quadNdx];
			vertexItr++;
		}
	}

	return vertices;
}